

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

string * __thiscall
cfd::core::DescriptorKeyReference::GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorKeyReference *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->argument_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->argument_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyReference::GetArgument() const { return argument_; }